

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O1

void llama_grammar_accept_str(llama_grammar *grammar,string *piece)

{
  runtime_error *this;
  uint32_t *puVar1;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> local_50;
  
  decode_utf8(&local_50,piece,grammar->partial_utf8);
  for (puVar1 = local_50.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != local_50.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1; puVar1 = puVar1 + 1) {
    llama_grammar_accept(grammar,*puVar1);
  }
  grammar->partial_utf8 = local_50.second;
  if ((grammar->stacks).
      super__Vector_base<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (grammar->stacks).
      super__Vector_base<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (local_50.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint32_t *)0x0) {
      operator_delete(local_50.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.first.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.first.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"Unexpected empty grammar stack after accepting piece: ",piece);
  std::runtime_error::runtime_error(this,(string *)&local_70);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_grammar_accept_str(struct llama_grammar & grammar, const std::string & piece) {
    // Note terminating 0 in decoded string
    const auto   decoded     = decode_utf8(piece, grammar.partial_utf8);
    const auto & code_points = decoded.first;

    for (auto it = code_points.begin(), end = code_points.end() - 1; it != end; ++it) {
        llama_grammar_accept(&grammar, *it);
    }

    grammar.partial_utf8 = decoded.second;
    if (grammar.stacks.empty()) {
        throw std::runtime_error("Unexpected empty grammar stack after accepting piece: " + piece);
    }
}